

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyz.h
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyz::NodeIntStateScatterAcceleration
          (ChNodeFEAxyz *this,uint off_a,ChStateDelta *a)

{
  ChVector<double> local_68;
  double *local_48;
  undefined8 local_40;
  ChStateDelta *local_30;
  ulong local_28;
  long local_18;
  
  local_28 = (ulong)off_a;
  local_48 = (a->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             local_28;
  local_18 = (a->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_40 = 3;
  local_30 = a;
  if ((long)local_28 <= local_18 + -3) {
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_68,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_48,(type *)0x0);
    if ((ChVector<double> *)&this->field_0x50 != &local_68) {
      *(double *)&this->field_0x50 = local_68.m_data[0];
      *(double *)&this->field_0x58 = local_68.m_data[1];
      *(double *)&this->field_0x60 = local_68.m_data[2];
    }
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

virtual void NodeIntStateScatterAcceleration(const unsigned int off_a, const ChStateDelta& a) override {
        SetPos_dtdt(a.segment(off_a, 3));
    }